

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

void __thiscall despot::BaseTag::PrintState(BaseTag *this,State *s,ostream *out)

{
  int iVar1;
  int iVar2;
  int iVar3;
  const_reference pvVar4;
  int local_38;
  int index;
  int x;
  int y;
  int oindex;
  int aindex;
  TagState *state;
  ostream *out_local;
  State *s_local;
  BaseTag *this_local;
  
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->rob_,(long)*(int *)(s + 0xc));
  iVar1 = *pvVar4;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->opp_,(long)*(int *)(s + 0xc));
  iVar2 = *pvVar4;
  index = despot::Floor::num_rows();
  while (index = index + -1, -1 < index) {
    for (local_38 = 0; iVar3 = despot::Floor::num_cols(), local_38 < iVar3; local_38 = local_38 + 1)
    {
      iVar3 = Floor::GetIndex(&this->floor_,local_38,index);
      if (iVar3 == (int)Floor::INVALID) {
        std::operator<<(out,"#");
      }
      else if ((iVar3 == iVar1) && (iVar3 == iVar2)) {
        std::operator<<(out,"Q");
      }
      else if (iVar3 == iVar1) {
        std::operator<<(out,"R");
      }
      else if (iVar3 == iVar2) {
        std::operator<<(out,"O");
      }
      else {
        std::operator<<(out,".");
      }
    }
    std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void BaseTag::PrintState(const State& s, ostream& out) const {
	const TagState& state = static_cast<const TagState&>(s);

	int aindex = rob_[state.state_id];
	int oindex = opp_[state.state_id];

	for (int y = floor_.num_rows()-1; y >= 0; y--) {
		for (int x = 0; x < floor_.num_cols(); x++) {
			int index = floor_.GetIndex(x, y);
			if (index == Floor::INVALID)
				out << "#";
			else if (index == aindex && index == oindex)
				out << "Q";
			else if (index == aindex)
				out << "R";
			else if (index == oindex)
				out << "O";
			else
				out << ".";
		}
		out << endl;
	}
}